

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::
     Deallocate<4ul,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>>
               (allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_> *alloc,
               void *p,size_t n)

{
  allocator<phmap::priv::Deallocate<4ul,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>>(std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>*,void*,unsigned_long)::M>
  local_21;
  size_t sStack_20;
  A mem_alloc;
  size_t n_local;
  void *p_local;
  allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_> *alloc_local;
  
  sStack_20 = n;
  if (n == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0x106f,
                  "void phmap::priv::Deallocate(Alloc *, void *, size_t) [Alignment = 4UL, Alloc = std::allocator<std::pair<const int, phmap::priv::(anonymous namespace)::balast>>]"
                 );
  }
  std::
  allocator<phmap::priv::Deallocate<4ul,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>>(std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>*,void*,unsigned_long)::M>
  ::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>(&local_21,alloc);
  allocator_traits<std::allocator<M>_>::deallocate
            ((allocator<M> *)&local_21,(pointer_conflict)p,sStack_20 + 3 >> 2);
  std::allocator<M>::~allocator((allocator<M> *)&local_21);
  return;
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  struct alignas(Alignment) M {};
  using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
  A mem_alloc(*alloc);
  AT::deallocate(mem_alloc, static_cast<M*>(p),
                 (n + sizeof(M) - 1) / sizeof(M));
}